

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seekforintruder.cpp
# Opt level: O0

bool sfi::logic::validateAddr(string *addr)

{
  bool bVar1;
  ulong uVar2;
  istream *piVar3;
  unsigned_long uVar4;
  size_type sVar5;
  reference pvVar6;
  int local_1f8;
  int i;
  exception e;
  value_type local_1e4;
  string local_1e0 [8];
  string oct;
  istringstream local_1b0 [8];
  istringstream ss;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> octets;
  string *addr_local;
  
  octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)addr;
  uVar2 = std::__cxx11::string::length();
  if (0xf < uVar2) {
    return false;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  std::__cxx11::istringstream::istringstream
            (local_1b0,
             octets.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_end_of_storage,8);
  std::__cxx11::string::string(local_1e0);
  while( true ) {
    piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_1b0,local_1e0,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    uVar4 = std::__cxx11::stoul((string *)local_1e0,(size_t *)0x0,10);
    local_1e4 = (value_type)uVar4;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)local_30,&local_1e4);
  }
  sVar5 = std::vector<int,_std::allocator<int>_>::size
                    ((vector<int,_std::allocator<int>_> *)local_30);
  if (sVar5 < 4) {
    addr_local._7_1_ = false;
  }
  else {
    pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,0);
    if ((*pvVar6 < 0x100) &&
       (pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_30,0), 0 < *pvVar6)) {
      sVar5 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_30);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_30,sVar5 - 1);
      if (*pvVar6 < 0xff) {
        for (local_1f8 = 1;
            sVar5 = std::vector<int,_std::allocator<int>_>::size
                              ((vector<int,_std::allocator<int>_> *)local_30),
            (ulong)(long)local_1f8 < sVar5 - 1; local_1f8 = local_1f8 + 1) {
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_30,(long)local_1f8);
          if (0xff < *pvVar6) {
            addr_local._7_1_ = false;
            goto LAB_0010b110;
          }
        }
        addr_local._7_1_ = true;
      }
      else {
        addr_local._7_1_ = false;
      }
    }
    else {
      addr_local._7_1_ = false;
    }
  }
LAB_0010b110:
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::istringstream::~istringstream(local_1b0);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return addr_local._7_1_;
}

Assistant:

static bool sfi::logic::validateAddr(const string& addr){
    if(addr.length() > 15)
        return false;
    vector<int>octets;
    istringstream ss(addr);
    string oct;
    while(getline(ss,oct,'.')){
        try {
            octets.push_back(stoul(oct));
        } catch (exception e) {
            return false;
        }
    }

    if(octets.size() < 4)
        return false;

    if(octets[0] > 255 || octets[0] < 1)
        return false;

    if(octets[octets.size()-1] > 254)
        return false;

    for(int i = 1 ; i < octets.size()-1 ; i++){
        if(octets[i] > 255)
            return false;
    }
    return true;
}